

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructor_injection_ambiguous_constructors_via_BOOST_DI_INJECT_TRAITS.cpp
# Opt level: O3

int main(void)

{
  return 0;
}

Assistant:

int main() {
  // clang-format off
  auto injector = di::make_injector(
    di::bind<int>().to(42)
  , di::bind<double>().to(87.0)
  );
  // clang-format on
  auto object = injector.create<T>();
  assert(42 == object.a);
  assert(87.0 == object.d);
}